

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

int fileIn(FILE *fp)

{
  uint8_t uVar1;
  int iVar2;
  object **ppoVar3;
  object *poVar4;
  int64_t iVar5;
  object *poVar6;
  object *poVar7;
  int64_t iVar8;
  uint uVar9;
  ulong uVar10;
  size_t __n;
  ulong uVar11;
  byteObject *bobj;
  long lVar12;
  long lVar13;
  int local_50;
  undefined8 local_48;
  object *imagePointer;
  object *imageBase;
  
  uVar1 = get_image_version(fp);
  switch(uVar1) {
  case '\0':
    lVar12 = 0;
    info_impl("fileIn",99,"Reading in version 0 image.");
    if (inSpaceOne == 0) {
      ppoVar3 = &spaceOne;
    }
    else {
      ppoVar3 = &spaceTwo;
    }
    indirArray = (object **)*ppoVar3;
    indirtop = 0;
    fwrite("reading nil object.\n",0x14,1,_stderr);
    nilObject = objectRead(fp);
    addStaticRoot(&nilObject);
    fwrite("reading true object.\n",0x15,1,_stderr);
    trueObject = objectRead(fp);
    addStaticRoot(&trueObject);
    fwrite("reading false object.\n",0x16,1,_stderr);
    falseObject = objectRead(fp);
    addStaticRoot(&falseObject);
    fwrite("reading globals object.\n",0x18,1,_stderr);
    globalsObject = objectRead(fp);
    addStaticRoot(&globalsObject);
    fwrite("reading SmallInt class.\n",0x18,1,_stderr);
    SmallIntClass = objectRead(fp);
    addStaticRoot(&SmallIntClass);
    fwrite("reading Integer class.\n",0x17,1,_stderr);
    IntegerClass = objectRead(fp);
    addStaticRoot(&IntegerClass);
    fwrite("reading Array class.\n",0x15,1,_stderr);
    ArrayClass = objectRead(fp);
    addStaticRoot(&ArrayClass);
    fwrite("reading Block class.\n",0x15,1,_stderr);
    BlockClass = objectRead(fp);
    addStaticRoot(&BlockClass);
    fwrite("reading Context class.\n",0x17,1,_stderr);
    ContextClass = objectRead(fp);
    addStaticRoot(&ContextClass);
    fwrite("reading initial method.\n",0x18,1,_stderr);
    initialMethod = objectRead(fp);
    addStaticRoot(&initialMethod);
    fwrite("reading binary message objects.\n",0x20,1,_stderr);
    for (; lVar12 != 0x18; lVar12 = lVar12 + 8) {
      poVar4 = objectRead(fp);
      *(object **)((long)binaryMessages + lVar12) = poVar4;
      addStaticRoot((object **)((long)binaryMessages + lVar12));
    }
    fwrite("reading bad method symbol.\n",0x1b,1,_stderr);
    badMethodSym = objectRead(fp);
    addStaticRoot(&badMethodSym);
    memset(indirArray,0,(long)spaceSize << 4);
    goto LAB_00106cb8;
  case '\x01':
    lVar12 = 0;
    info_impl("fileIn",0x68,"Reading in version 1 image.");
    if (inSpaceOne == 0) {
      ppoVar3 = &spaceOne;
    }
    else {
      ppoVar3 = &spaceTwo;
    }
    indirArray = (object **)*ppoVar3;
    indirtop = 0;
    fwrite("reading globals object.\n",0x18,1,_stderr);
    globalsObject = objectRead(fp);
    addStaticRoot(&globalsObject);
    fwrite("reading initial method.\n",0x18,1,_stderr);
    initialMethod = objectRead(fp);
    addStaticRoot(&initialMethod);
    fwrite("reading binary message objects.\n",0x20,1,_stderr);
    for (; lVar12 != 0x18; lVar12 = lVar12 + 8) {
      poVar4 = objectRead(fp);
      *(object **)((long)binaryMessages + lVar12) = poVar4;
      addStaticRoot((object **)((long)binaryMessages + lVar12));
    }
    fwrite("reading bad method symbol.\n",0x1b,1,_stderr);
    badMethodSym = objectRead(fp);
    addStaticRoot(&badMethodSym);
    nilObject = lookupGlobal("nil");
    addStaticRoot(&nilObject);
    trueObject = lookupGlobal("true");
    addStaticRoot(&trueObject);
    falseObject = lookupGlobal("false");
    addStaticRoot(&falseObject);
    ArrayClass = lookupGlobal("Array");
    addStaticRoot(&ArrayClass);
    BlockClass = lookupGlobal("Block");
    addStaticRoot(&BlockClass);
    ByteArrayClass = lookupGlobal("ByteArray");
    addStaticRoot(&ByteArrayClass);
    ContextClass = lookupGlobal("Context");
    addStaticRoot(&ContextClass);
    DictionaryClass = lookupGlobal("Dictionary");
    addStaticRoot(&DictionaryClass);
    IntegerClass = lookupGlobal("Integer");
    addStaticRoot(&IntegerClass);
    SmallIntClass = lookupGlobal("SmallInt");
    addStaticRoot(&SmallIntClass);
    StringClass = lookupGlobal("String");
    addStaticRoot(&StringClass);
    SymbolClass = lookupGlobal("Symbol");
    addStaticRoot(&SymbolClass);
    UndefinedClass = lookupGlobal("Undefined");
    addStaticRoot(&UndefinedClass);
    memset(indirArray,0,(long)spaceSize << 4);
LAB_00106cb8:
    fprintf(_stderr,"Read in %d objects.\n",(ulong)(uint)indirtop);
    iVar2 = indirtop;
    break;
  case '\x02':
    info_impl("fileIn",0x6d,"Reading in version 2 image.");
    fread(&imageBase,8,1,(FILE *)fp);
    fprintf(_stderr,"Read in image imageBase=%p\n");
    fread(&imagePointer,8,1,(FILE *)fp);
    fprintf(_stderr,"Read in image imagePointer=%p\n",imagePointer);
    fread(&local_48,8,1,(FILE *)fp);
    fprintf(_stderr,"Read in image imageTop=%p\n",local_48);
    iVar2 = ((int)local_48 - (int)imagePointer) / 8;
    __n = (size_t)iVar2;
    fprintf(_stderr,"Image has %ld cells.\n",__n);
    fprintf(_stderr,"memoryBase is %p\n",memoryBase);
    fprintf(_stderr,"memoryPointer is %p\n",memoryPointer);
    fprintf(_stderr,"memoryTop is %p\n",memoryTop);
    lVar12 = (long)memoryBase - (long)imageBase;
    fprintf(_stderr,"Address offset between image and current memory pointer is %ld bytes.\n",lVar12
           );
    lVar12 = lVar12 / 8;
    fprintf(_stderr,"Address offset between image and current memory pointer is %ld cells.\n",lVar12
           );
    memoryPointer = (object *)((long)memoryTop + __n * -8);
    fread(&globalsObject,8,1,(FILE *)fp);
    globalsObject = fix_offset(globalsObject,lVar12);
    addStaticRoot(&globalsObject);
    fprintf(_stderr,"Read in globals object=%p\n",globalsObject);
    fread(&initialMethod,8,1,(FILE *)fp);
    initialMethod = fix_offset(initialMethod,lVar12);
    addStaticRoot(&initialMethod);
    fprintf(_stderr,"Read in initial method=%p\n",initialMethod);
    fwrite("Reading binary message objects.\n",0x20,1,_stderr);
    lVar13 = 0;
    for (uVar11 = 0; uVar11 != 3; uVar11 = uVar11 + 1) {
      fread((object **)((long)binaryMessages + lVar13),8,1,(FILE *)fp);
      poVar4 = fix_offset(binaryMessages[uVar11],lVar12);
      binaryMessages[uVar11] = poVar4;
      addStaticRoot((object **)((long)binaryMessages + lVar13));
      fprintf(_stderr,"  Read in binary message %d=%p\n",uVar11 & 0xffffffff,binaryMessages[uVar11])
      ;
      lVar13 = lVar13 + 8;
    }
    fread(&badMethodSym,8,1,(FILE *)fp);
    badMethodSym = fix_offset(badMethodSym,lVar12);
    addStaticRoot(&badMethodSym);
    fprintf(_stderr,"Read in doesNotUnderstand: symbol=%p\n",badMethodSym);
    fread(memoryPointer,8,__n,(FILE *)fp);
    iVar5 = time_usec();
    for (poVar4 = memoryPointer; poVar4 < memoryTop;
        poVar4 = (object *)((long)&poVar4->header + (ulong)(uVar9 * 8 + 0x10))) {
      if (poVar4 == (object *)0x0) {
        error_impl("object_fix_up",0x3d1,"Fixing up a null object!");
      }
      uVar11 = poVar4->header;
      uVar10 = uVar11 >> 2 & 0x3fffffff;
      uVar9 = (uint)uVar10;
      poVar6 = fix_offset(poVar4->class,lVar12);
      poVar4->class = poVar6;
      if ((uVar11 & 2) == 0) {
        for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
          poVar6 = (object *)(&poVar4[1].header)[uVar11];
          poVar7 = nilObject;
          if (poVar6 == (object *)0x0) {
LAB_001065a1:
            (&poVar4[1].header)[uVar11] = (uintptr_t)poVar7;
          }
          else if (((ulong)poVar6 & 1) == 0) {
            poVar7 = fix_offset(poVar6,lVar12);
            goto LAB_001065a1;
          }
        }
      }
      else {
        uVar9 = uVar9 + 7 >> 3;
      }
    }
    iVar8 = time_usec();
    nilObject = lookupGlobal("nil");
    addStaticRoot(&nilObject);
    trueObject = lookupGlobal("true");
    addStaticRoot(&trueObject);
    falseObject = lookupGlobal("false");
    addStaticRoot(&falseObject);
    ArrayClass = lookupGlobal("Array");
    addStaticRoot(&ArrayClass);
    BlockClass = lookupGlobal("Block");
    addStaticRoot(&BlockClass);
    ByteArrayClass = lookupGlobal("ByteArray");
    addStaticRoot(&ByteArrayClass);
    ContextClass = lookupGlobal("Context");
    addStaticRoot(&ContextClass);
    DictionaryClass = lookupGlobal("Dictionary");
    addStaticRoot(&DictionaryClass);
    IntegerClass = lookupGlobal("Integer");
    addStaticRoot(&IntegerClass);
    SmallIntClass = lookupGlobal("SmallInt");
    addStaticRoot(&SmallIntClass);
    StringClass = lookupGlobal("String");
    addStaticRoot(&StringClass);
    SymbolClass = lookupGlobal("Symbol");
    addStaticRoot(&SymbolClass);
    UndefinedClass = lookupGlobal("Undefined");
    addStaticRoot(&UndefinedClass);
    local_50 = (int)iVar5;
    fprintf(_stderr,"Object fix up took %d usec.\n",(ulong)(uint)((int)iVar8 - local_50));
    fprintf(_stderr,"Read in %ld cells.\n",__n);
    break;
  case '\x03':
    info_impl("fileIn",0x72,"Reading in version 3 image.");
    if (inSpaceOne == 0) {
      ppoVar3 = &spaceOne;
    }
    else {
      ppoVar3 = &spaceTwo;
    }
    indirArray = (object **)*ppoVar3;
    indirtop = 0;
    info_impl("fileIn_version_3",0x156,"reading globals object.");
    globalsObject = objectRead(fp);
    addStaticRoot(&globalsObject);
    if (debugging != 0) {
      printf("Globals: ");
      dumpDictKeys(globalsObject);
      putchar(10);
    }
    info_impl("fileIn_version_3",0x161,"Finding special symbols.");
    poVar4 = lookupGlobal("specialSymbols");
    binaryMessages[0] = (object *)poVar4[1].header;
    addStaticRoot(binaryMessages);
    binaryMessages[1] = poVar4[1].class;
    addStaticRoot(binaryMessages + 1);
    binaryMessages[2] = (object *)poVar4[2].header;
    addStaticRoot(binaryMessages + 2);
    badMethodSym = poVar4[2].class;
    addStaticRoot(&badMethodSym);
    nilObject = lookupGlobal("nil");
    addStaticRoot(&nilObject);
    trueObject = lookupGlobal("true");
    addStaticRoot(&trueObject);
    falseObject = lookupGlobal("false");
    addStaticRoot(&falseObject);
    ArrayClass = lookupGlobal("Array");
    addStaticRoot(&ArrayClass);
    BlockClass = lookupGlobal("Block");
    addStaticRoot(&BlockClass);
    ByteArrayClass = lookupGlobal("ByteArray");
    addStaticRoot(&ByteArrayClass);
    ContextClass = lookupGlobal("Context");
    addStaticRoot(&ContextClass);
    DictionaryClass = lookupGlobal("Dictionary");
    addStaticRoot(&DictionaryClass);
    IntegerClass = lookupGlobal("Integer");
    addStaticRoot(&IntegerClass);
    SmallIntClass = lookupGlobal("SmallInt");
    addStaticRoot(&SmallIntClass);
    StringClass = lookupGlobal("String");
    addStaticRoot(&StringClass);
    SymbolClass = lookupGlobal("Symbol");
    addStaticRoot(&SymbolClass);
    UndefinedClass = lookupGlobal("Undefined");
    addStaticRoot(&UndefinedClass);
    info_impl("fileIn_version_3",0x198,"Memory top %p",memoryTop);
    info_impl("fileIn_version_3",0x199,"Memory pointer %p",memoryPointer);
    info_impl("fileIn_version_3",0x19b,"Read in %d objects.",(ulong)(uint)indirtop);
    iVar2 = indirtop;
    break;
  default:
    error_impl("fileIn",0x77,"Unsupported image file version: %u.");
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int fileIn(FILE *fp)
{
    uint8_t version = get_image_version(fp);

    switch(version) {
    case IMAGE_VERSION_0:
        info("Reading in version 0 image.");
        return fileIn_version_0(fp);
        break;

    case IMAGE_VERSION_1:
        info("Reading in version 1 image.");
        return fileIn_version_1(fp);
        break;

    case IMAGE_VERSION_2:
        info("Reading in version 2 image.");
        return fileIn_version_2(fp);
        break;

    case IMAGE_VERSION_3:
        info("Reading in version 3 image.");
        return fileIn_version_3(fp);
        break;

    default:
        error("Unsupported image file version: %u.", version);
        break;
    }

    return 0;
}